

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O1

dlist_t * dlist_ins_front(dlist_head_t *head,void *data)

{
  int iVar1;
  dlist_t *dlist;
  
  dlist = (dlist_t *)malloc(0x18);
  if (dlist != (dlist_t *)0x0) {
    dlist->next = (dlist_s *)0x0;
    dlist->prev = (dlist_s *)0x0;
    dlist->data = data;
    iVar1 = dlist_insl_front(head,dlist);
    if (iVar1 != 0) {
      return dlist;
    }
    free(dlist);
  }
  return (dlist_t *)0x0;
}

Assistant:

dlist_t *dlist_ins_front(dlist_head_t *head, void *data) {
   dlist_t *dlist = dlist_new(data);

   if (!dlist)
      return NULL;

   if (dlist_insl_front(head, dlist)) {
      return dlist;
   } else {
      dlist_delete(dlist, NULL);
      return NULL;
   }
}